

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O3

REF_STATUS ref_sort_insertion_int(REF_INT n,REF_INT *original,REF_INT *sorted)

{
  ulong uVar1;
  REF_INT RVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
    uVar4 = 0;
    do {
      sorted[uVar4] = original[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    if (0 < n) {
      uVar5 = 1;
      uVar4 = 0;
      do {
        uVar1 = uVar4 + 1;
        if (uVar1 < uVar3) {
          uVar6 = uVar5;
          uVar9 = uVar4 & 0xffffffff;
          do {
            uVar8 = uVar6 & 0xffffffff;
            if (sorted[(int)uVar9] <= sorted[uVar6]) {
              uVar8 = uVar9;
            }
            uVar6 = uVar6 + 1;
            iVar7 = (int)uVar8;
            uVar9 = uVar8;
          } while (uVar3 != uVar6);
        }
        else {
          iVar7 = (int)uVar4;
        }
        RVar2 = sorted[uVar4];
        sorted[uVar4] = sorted[iVar7];
        sorted[iVar7] = RVar2;
        uVar5 = uVar5 + 1;
        uVar4 = uVar1;
      } while (uVar1 != uVar3);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_insertion_int(REF_INT n, REF_INT *original,
                                          REF_INT *sorted) {
  REF_INT i, j, smallest, temp;

  for (i = 0; i < n; i++) sorted[i] = original[i];

  for (i = 0; i < n; i++) {
    smallest = i;
    for (j = i + 1; j < n; j++) {
      if (sorted[j] < sorted[smallest]) smallest = j;
    }
    temp = sorted[i];
    sorted[i] = sorted[smallest];
    sorted[smallest] = temp;
  }

  return REF_SUCCESS;
}